

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::Swap
          (GeneratedMessageReflection *this,Message *message1,Message *message2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CppType CVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Descriptor *pDVar5;
  string *psVar6;
  RepeatedField<long> *this_00;
  RepeatedField<long> *other;
  RepeatedField<unsigned_int> *this_01;
  RepeatedField<unsigned_int> *other_00;
  RepeatedField<unsigned_long> *this_02;
  RepeatedField<unsigned_long> *other_01;
  RepeatedField<float> *this_03;
  RepeatedField<float> *other_02;
  RepeatedField<double> *this_04;
  RepeatedField<double> *other_03;
  RepeatedField<bool> *this_05;
  RepeatedField<bool> *other_04;
  RepeatedField<int> *pRVar7;
  RepeatedField<int> *pRVar8;
  RepeatedPtrFieldBase *this_06;
  RepeatedPtrFieldBase *other_05;
  long *__a;
  long *__b;
  uint *__a_00;
  uint *__b_00;
  unsigned_long *__a_01;
  unsigned_long *__b_01;
  float *__a_02;
  float *__b_02;
  double *__a_03;
  double *__b_03;
  bool *__a_04;
  bool *__b_04;
  int *piVar9;
  int *piVar10;
  Message **__a_05;
  Message **__b_05;
  FieldOptions *this_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **__a_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **__b_06;
  LogMessage *pLVar11;
  ExtensionSet *this_08;
  ExtensionSet *x;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  LogFinisher local_151;
  LogMessage local_150;
  LogFinisher local_111;
  LogMessage local_110;
  FieldDescriptor *local_d8;
  FieldDescriptor *field;
  int local_c8;
  int i_1;
  int i;
  int has_bits_size;
  uint32 *has_bits2;
  uint32 *has_bits1;
  LogMessage local_a8;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  Message *local_20;
  Message *message2_local;
  Message *message1_local;
  GeneratedMessageReflection *this_local;
  
  if (message1 != message2) {
    local_20 = message2;
    message2_local = message1;
    message1_local = (Message *)this;
    iVar2 = (*(message1->super_MessageLite)._vptr_MessageLite[0x12])();
    local_59 = 0;
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var,iVar2) != this) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x13b);
      local_59 = 1;
      pLVar11 = LogMessage::operator<<
                          (&local_58,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar11 = LogMessage::operator<<(pLVar11,"First argument to Swap() (of type \"");
      pDVar5 = Message::GetDescriptor(message2_local);
      psVar6 = Descriptor::full_name_abi_cxx11_(pDVar5);
      pLVar11 = LogMessage::operator<<(pLVar11,psVar6);
      pLVar11 = LogMessage::operator<<
                          (pLVar11,
                           "\") is not compatible with this reflection object (which is for type \""
                          );
      psVar6 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
      pLVar11 = LogMessage::operator<<(pLVar11,psVar6);
      pLVar11 = LogMessage::operator<<
                          (pLVar11,
                           "\").  Note that the exact same class is required; not just the same descriptor."
                          );
      LogFinisher::operator=(local_6d,pLVar11);
    }
    if ((local_59 & 1) != 0) {
      LogMessage::~LogMessage(&local_58);
    }
    iVar2 = (*(local_20->super_MessageLite)._vptr_MessageLite[0x12])();
    has_bits1._7_1_ = 0;
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var_00,iVar2) != this) {
      LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x142);
      has_bits1._7_1_ = 1;
      pLVar11 = LogMessage::operator<<
                          (&local_a8,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar11 = LogMessage::operator<<(pLVar11,"Second argument to Swap() (of type \"");
      pDVar5 = Message::GetDescriptor(local_20);
      psVar6 = Descriptor::full_name_abi_cxx11_(pDVar5);
      pLVar11 = LogMessage::operator<<(pLVar11,psVar6);
      pLVar11 = LogMessage::operator<<
                          (pLVar11,
                           "\") is not compatible with this reflection object (which is for type \""
                          );
      psVar6 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
      pLVar11 = LogMessage::operator<<(pLVar11,psVar6);
      pLVar11 = LogMessage::operator<<
                          (pLVar11,
                           "\").  Note that the exact same class is required; not just the same descriptor."
                          );
      LogFinisher::operator=((LogFinisher *)((long)&has_bits1 + 6),pLVar11);
    }
    if ((has_bits1._7_1_ & 1) != 0) {
      LogMessage::~LogMessage(&local_a8);
    }
    has_bits2 = MutableHasBits(this,message2_local);
    _i = MutableHasBits(this,local_20);
    iVar2 = Descriptor::field_count(this->descriptor_);
    i_1 = (iVar2 + 0x1f) / 0x20;
    for (local_c8 = 0; local_c8 < i_1; local_c8 = local_c8 + 1) {
      std::swap<unsigned_int>(has_bits2 + local_c8,_i + local_c8);
    }
    for (field._4_4_ = 0; iVar2 = field._4_4_, iVar3 = Descriptor::field_count(this->descriptor_),
        iVar2 < iVar3; field._4_4_ = field._4_4_ + 1) {
      local_d8 = Descriptor::field(this->descriptor_,field._4_4_);
      bVar1 = FieldDescriptor::is_repeated(local_d8);
      if (bVar1) {
        CVar4 = FieldDescriptor::cpp_type(local_d8);
        switch(CVar4) {
        case CPPTYPE_INT32:
          pRVar7 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message2_local,local_d8);
          pRVar8 = MutableRaw<google::protobuf::RepeatedField<int>>(this,local_20,local_d8);
          RepeatedField<int>::Swap(pRVar7,pRVar8);
          break;
        case CPPTYPE_INT64:
          this_00 = MutableRaw<google::protobuf::RepeatedField<long>>(this,message2_local,local_d8);
          other = MutableRaw<google::protobuf::RepeatedField<long>>(this,local_20,local_d8);
          RepeatedField<long>::Swap(this_00,other);
          break;
        case CPPTYPE_UINT32:
          this_01 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>
                              (this,message2_local,local_d8);
          other_00 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>
                               (this,local_20,local_d8);
          RepeatedField<unsigned_int>::Swap(this_01,other_00);
          break;
        case CPPTYPE_UINT64:
          this_02 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>
                              (this,message2_local,local_d8);
          other_01 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>
                               (this,local_20,local_d8);
          RepeatedField<unsigned_long>::Swap(this_02,other_01);
          break;
        case CPPTYPE_DOUBLE:
          this_04 = MutableRaw<google::protobuf::RepeatedField<double>>
                              (this,message2_local,local_d8);
          other_03 = MutableRaw<google::protobuf::RepeatedField<double>>(this,local_20,local_d8);
          RepeatedField<double>::Swap(this_04,other_03);
          break;
        case CPPTYPE_FLOAT:
          this_03 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message2_local,local_d8)
          ;
          other_02 = MutableRaw<google::protobuf::RepeatedField<float>>(this,local_20,local_d8);
          RepeatedField<float>::Swap(this_03,other_02);
          break;
        case CPPTYPE_BOOL:
          this_05 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message2_local,local_d8);
          other_04 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,local_20,local_d8);
          RepeatedField<bool>::Swap(this_05,other_04);
          break;
        case CPPTYPE_ENUM:
          pRVar7 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message2_local,local_d8);
          pRVar8 = MutableRaw<google::protobuf::RepeatedField<int>>(this,local_20,local_d8);
          RepeatedField<int>::Swap(pRVar7,pRVar8);
          break;
        case CPPTYPE_STRING:
        case CPPTYPE_MESSAGE:
          this_06 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                              (this,message2_local,local_d8);
          other_05 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                               (this,local_20,local_d8);
          RepeatedPtrFieldBase::Swap(this_06,other_05);
          break;
        default:
          LogMessage::LogMessage
                    (&local_110,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                     ,0x16d);
          pLVar11 = LogMessage::operator<<(&local_110,"Unimplemented type: ");
          CVar4 = FieldDescriptor::cpp_type(local_d8);
          pLVar11 = LogMessage::operator<<(pLVar11,CVar4);
          LogFinisher::operator=(&local_111,pLVar11);
          LogMessage::~LogMessage(&local_110);
        }
      }
      else {
        CVar4 = FieldDescriptor::cpp_type(local_d8);
        switch(CVar4) {
        case CPPTYPE_INT32:
          piVar9 = MutableRaw<int>(this,message2_local,local_d8);
          piVar10 = MutableRaw<int>(this,local_20,local_d8);
          std::swap<int>(piVar9,piVar10);
          break;
        case CPPTYPE_INT64:
          __a = MutableRaw<long>(this,message2_local,local_d8);
          __b = MutableRaw<long>(this,local_20,local_d8);
          std::swap<long>(__a,__b);
          break;
        case CPPTYPE_UINT32:
          __a_00 = MutableRaw<unsigned_int>(this,message2_local,local_d8);
          __b_00 = MutableRaw<unsigned_int>(this,local_20,local_d8);
          std::swap<unsigned_int>(__a_00,__b_00);
          break;
        case CPPTYPE_UINT64:
          __a_01 = MutableRaw<unsigned_long>(this,message2_local,local_d8);
          __b_01 = MutableRaw<unsigned_long>(this,local_20,local_d8);
          std::swap<unsigned_long>(__a_01,__b_01);
          break;
        case CPPTYPE_DOUBLE:
          __a_03 = MutableRaw<double>(this,message2_local,local_d8);
          __b_03 = MutableRaw<double>(this,local_20,local_d8);
          std::swap<double>(__a_03,__b_03);
          break;
        case CPPTYPE_FLOAT:
          __a_02 = MutableRaw<float>(this,message2_local,local_d8);
          __b_02 = MutableRaw<float>(this,local_20,local_d8);
          std::swap<float>(__a_02,__b_02);
          break;
        case CPPTYPE_BOOL:
          __a_04 = MutableRaw<bool>(this,message2_local,local_d8);
          __b_04 = MutableRaw<bool>(this,local_20,local_d8);
          std::swap<bool>(__a_04,__b_04);
          break;
        case CPPTYPE_ENUM:
          piVar9 = MutableRaw<int>(this,message2_local,local_d8);
          piVar10 = MutableRaw<int>(this,local_20,local_d8);
          std::swap<int>(piVar9,piVar10);
          break;
        case CPPTYPE_STRING:
          this_07 = FieldDescriptor::options(local_d8);
          FieldOptions::ctype(this_07);
          __a_06 = MutableRaw<std::__cxx11::string*>(this,message2_local,local_d8);
          __b_06 = MutableRaw<std::__cxx11::string*>(this,local_20,local_d8);
          std::swap<std::__cxx11::string*>(__a_06,__b_06);
          break;
        case CPPTYPE_MESSAGE:
          __a_05 = MutableRaw<google::protobuf::Message*>(this,message2_local,local_d8);
          __b_05 = MutableRaw<google::protobuf::Message*>(this,local_20,local_d8);
          std::swap<google::protobuf::Message*>(__a_05,__b_05);
          break;
        default:
          LogMessage::LogMessage
                    (&local_150,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                     ,400);
          pLVar11 = LogMessage::operator<<(&local_150,"Unimplemented type: ");
          CVar4 = FieldDescriptor::cpp_type(local_d8);
          pLVar11 = LogMessage::operator<<(pLVar11,CVar4);
          LogFinisher::operator=(&local_151,pLVar11);
          LogMessage::~LogMessage(&local_150);
        }
      }
    }
    if (this->extensions_offset_ != -1) {
      this_08 = MutableExtensionSet(this,message2_local);
      x = MutableExtensionSet(this,local_20);
      ExtensionSet::Swap(this_08,x);
    }
    iVar2 = (*(this->super_Reflection)._vptr_Reflection[3])(this,message2_local);
    iVar3 = (*(this->super_Reflection)._vptr_Reflection[3])(this,local_20);
    UnknownFieldSet::Swap
              ((UnknownFieldSet *)CONCAT44(extraout_var_01,iVar2),
               (UnknownFieldSet *)CONCAT44(extraout_var_02,iVar3));
  }
  return;
}

Assistant:

void GeneratedMessageReflection::Swap(
    Message* message1,
    Message* message2) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
    << "First argument to Swap() (of type \""
    << message1->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
    << "Second argument to Swap() (of type \""
    << message2->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";

  uint32* has_bits1 = MutableHasBits(message1);
  uint32* has_bits2 = MutableHasBits(message2);
  int has_bits_size = (descriptor_->field_count() + 31) / 32;

  for (int i = 0; i < has_bits_size; i++) {
    std::swap(has_bits1[i], has_bits2[i]);
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define SWAP_ARRAYS(CPPTYPE, TYPE)                                           \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          MutableRaw<RepeatedField<TYPE> >(message1, field)->Swap(           \
              MutableRaw<RepeatedField<TYPE> >(message2, field));            \
          break;

          SWAP_ARRAYS(INT32 , int32 );
          SWAP_ARRAYS(INT64 , int64 );
          SWAP_ARRAYS(UINT32, uint32);
          SWAP_ARRAYS(UINT64, uint64);
          SWAP_ARRAYS(FLOAT , float );
          SWAP_ARRAYS(DOUBLE, double);
          SWAP_ARRAYS(BOOL  , bool  );
          SWAP_ARRAYS(ENUM  , int   );
#undef SWAP_ARRAYS

        case FieldDescriptor::CPPTYPE_STRING:
        case FieldDescriptor::CPPTYPE_MESSAGE:
          MutableRaw<RepeatedPtrFieldBase>(message1, field)->Swap(
              MutableRaw<RepeatedPtrFieldBase>(message2, field));
          break;

        default:
          GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
      }
    } else {
      switch (field->cpp_type()) {
#define SWAP_VALUES(CPPTYPE, TYPE)                                           \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          std::swap(*MutableRaw<TYPE>(message1, field),                      \
                    *MutableRaw<TYPE>(message2, field));                     \
          break;

          SWAP_VALUES(INT32 , int32 );
          SWAP_VALUES(INT64 , int64 );
          SWAP_VALUES(UINT32, uint32);
          SWAP_VALUES(UINT64, uint64);
          SWAP_VALUES(FLOAT , float );
          SWAP_VALUES(DOUBLE, double);
          SWAP_VALUES(BOOL  , bool  );
          SWAP_VALUES(ENUM  , int   );
#undef SWAP_VALUES
        case FieldDescriptor::CPPTYPE_MESSAGE:
          std::swap(*MutableRaw<Message*>(message1, field),
                    *MutableRaw<Message*>(message2, field));
          break;

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              std::swap(*MutableRaw<string*>(message1, field),
                        *MutableRaw<string*>(message2, field));
              break;
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
      }
    }
  }

  if (extensions_offset_ != -1) {
    MutableExtensionSet(message1)->Swap(MutableExtensionSet(message2));
  }

  MutableUnknownFields(message1)->Swap(MutableUnknownFields(message2));
}